

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O1

int light_iterate(light_pcapng pcapng,_func_light_boolean_light_pcapng_void_ptr *stop_fn,void *args)

{
  light_boolean lVar1;
  int iVar2;
  
  if (pcapng == (light_pcapng)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      lVar1 = (*stop_fn)(pcapng,args);
      if (lVar1 == LIGHT_FALSE) {
        return iVar2;
      }
      iVar2 = iVar2 + 1;
      pcapng = pcapng->next_block;
    } while (pcapng != (_light_pcapng *)0x0);
  }
  return iVar2;
}

Assistant:

int light_iterate(const light_pcapng pcapng, light_boolean (*stop_fn)(const light_pcapng, void *), void *args)
{
	int iterations = 0;
	light_pcapng iterator = pcapng;

	while (iterator != NULL) {
		if (stop_fn(iterator, args) == LIGHT_FALSE) {
			break;
		}
		iterations++;
		iterator = iterator->next_block;
	}

	return iterations;
}